

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

unsigned_long kj::_::convertToReturn<unsigned_long>(ExceptionOr<unsigned_long> *result)

{
  unsigned_long *puVar1;
  Exception *pEVar2;
  Exception *exception_1;
  Exception *_exception92;
  Exception *exception;
  Exception *_exception88;
  unsigned_long *value;
  unsigned_long *_value87;
  ExceptionOr<unsigned_long> *result_local;
  
  puVar1 = readMaybe<unsigned_long>(&result->value);
  if (puVar1 != (unsigned_long *)0x0) {
    pEVar2 = readMaybe<kj::Exception>((Maybe<kj::Exception> *)result);
    if (pEVar2 != (Exception *)0x0) {
      pEVar2 = mv<kj::Exception>(pEVar2);
      throwRecoverableException(pEVar2,0);
    }
    puVar1 = mv<unsigned_long>(puVar1);
    puVar1 = returnMaybeVoid<unsigned_long>(puVar1);
    return *puVar1;
  }
  pEVar2 = readMaybe<kj::Exception>((Maybe<kj::Exception> *)result);
  if (pEVar2 != (Exception *)0x0) {
    pEVar2 = mv<kj::Exception>(pEVar2);
    throwFatalException(pEVar2,0);
  }
  unreachable();
}

Assistant:

inline T convertToReturn(ExceptionOr<T>&& result) {
  KJ_IF_SOME(value, result.value) {
    KJ_IF_SOME(exception, result.exception) {
      throwRecoverableException(kj::mv(exception));
    }
    return _::returnMaybeVoid(kj::mv(value));
  } else KJ_IF_SOME(exception, result.exception) {
    throwFatalException(kj::mv(exception));
  } else {
    // Result contained neither a value nor an exception?
    KJ_UNREACHABLE;
  }